

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev-lang-demo.cpp
# Opt level: O1

void print_values(sensor *s)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint index;
  float fVar4;
  string local_50;
  
  iVar1 = ev3dev::sensor::decimals(s);
  uVar2 = ev3dev::sensor::num_values(s);
  if (uVar2 != 0) {
    index = 0;
    do {
      if (index != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"; ",2);
      }
      if (iVar1 == 0) {
        iVar3 = ev3dev::sensor::value(s,index);
        std::ostream::operator<<((ostream *)&std::cout,iVar3);
      }
      else {
        fVar4 = ev3dev::sensor::float_value(s,index);
        std::ostream::_M_insert<double>((double)fVar4);
      }
      index = index + 1;
    } while (uVar2 != index);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
  ev3dev::sensor::units_abi_cxx11_(&local_50,s);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,local_50._M_dataplus._M_p,local_50._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

void print_values(sensor &s)
{
  auto dp = s.decimals();
  unsigned m = s.num_values();
  for (unsigned i=0; i<m; ++i)
  {
    if (i) cout << "; ";
    if (dp)
      cout << s.float_value(i);
    else
      cout << s.value(i);
  }
  cout << " " << s.units();
}